

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  int iVar1;
  int iVar2;
  anon_union_224_1_493b367e_for_DescriptorProto_3 aVar3;
  uint uVar4;
  uint uVar5;
  Rep *pRVar6;
  size_t sVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  size_t sVar9;
  ulong uVar10;
  uint index;
  int n;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar11;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_03;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_04;
  long lVar12;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar13;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *pRVar14;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *pRVar15;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar16;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *pRVar17;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *pRVar18;
  
  lVar12 = (long)*(int *)((long)&this->field_0 + 0x10);
  pRVar11 = &(this->field_0)._impl_.field_;
  pRVar16 = pRVar11;
  if ((undefined1  [224])((undefined1  [224])this->field_0 & (undefined1  [224])0x1) !=
      (undefined1  [224])0x0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&pRVar11->super_RepeatedPtrFieldBase);
    pRVar16 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar6->elements;
  }
  if (((ulong)(pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&pRVar11->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar6->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar16 !=
         (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
         (&(pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar16 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                &(pRVar16->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = FieldDescriptorProto::ByteSizeLong
                      ((FieldDescriptorProto *)
                       (pRVar16->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.nested_type_;
  pRVar13 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar6->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar6->elements;
  }
  lVar12 = lVar12 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar13 !=
         (RepeatedPtrField<google::protobuf::DescriptorProto> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = ByteSizeLong((DescriptorProto *)
                         (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  this_01 = &(this->field_0)._impl_.enum_type_;
  pRVar14 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x38) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar14 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar6->elements;
  }
  if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    this_01 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar6->elements;
  }
  lVar12 = lVar12 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  for (; pRVar14 !=
         (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar14 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                &(pRVar14->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = EnumDescriptorProto::ByteSizeLong
                      ((EnumDescriptorProto *)
                       (pRVar14->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  this_02 = &(this->field_0)._impl_.extension_range_;
  pRVar15 = this_02;
  if ((*(byte *)((long)&this->field_0 + 0x50) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    pRVar15 = (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)pRVar6->elements
    ;
  }
  if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    this_02 = (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)pRVar6->elements
    ;
  }
  lVar12 = lVar12 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  for (; pRVar15 !=
         (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
         (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar15 = (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
                &(pRVar15->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = DescriptorProto_ExtensionRange::ByteSizeLong
                      ((DescriptorProto_ExtensionRange *)
                       (pRVar15->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x70);
  pRVar11 = &(this->field_0)._impl_.extension_;
  pRVar16 = pRVar11;
  if ((*(byte *)((long)&this->field_0 + 0x68) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&pRVar11->super_RepeatedPtrFieldBase);
    pRVar16 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar6->elements;
  }
  if (((ulong)(pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&pRVar11->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar6->elements;
  }
  lVar12 = lVar12 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x70);
  for (; pRVar16 !=
         (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
         (&(pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar16 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                &(pRVar16->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = FieldDescriptorProto::ByteSizeLong
                      ((FieldDescriptorProto *)
                       (pRVar16->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x88);
  this_03 = &(this->field_0)._impl_.oneof_decl_;
  pRVar17 = this_03;
  if ((*(byte *)((long)&this->field_0 + 0x80) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
    pRVar17 = (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)pRVar6->elements;
  }
  if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
    this_03 = (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)pRVar6->elements;
  }
  lVar12 = lVar12 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x88);
  for (; pRVar17 !=
         (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)
         (&(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar17 = (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)
                &(pRVar17->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = OneofDescriptorProto::ByteSizeLong
                      ((OneofDescriptorProto *)
                       (pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xa0);
  this_04 = &(this->field_0)._impl_.reserved_range_;
  pRVar18 = this_04;
  if ((*(byte *)((long)&this->field_0 + 0x98) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_04->super_RepeatedPtrFieldBase);
    pRVar18 = (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)pRVar6->elements;
  }
  if (((ulong)(this_04->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_04->super_RepeatedPtrFieldBase);
    this_04 = (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)pRVar6->elements;
  }
  lVar12 = lVar12 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0xa0);
  for (; pRVar18 !=
         (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
         (&(this_04->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar18 = (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
                &(pRVar18->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = DescriptorProto_ReservedRange::ByteSizeLong
                      ((DescriptorProto_ReservedRange *)
                       (pRVar18->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar12 = lVar12 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0xb8);
  sVar7 = lVar12 + (ulong)uVar4;
  if (0 < (int)uVar4) {
    index = 0;
    do {
      pVVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,index);
      uVar5 = (uint)pVVar8->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + pVVar8->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  aVar3 = this->field_0;
  if (((undefined1  [224])aVar3 & (undefined1  [224])0x7) != (undefined1  [224])0x0) {
    if (((undefined1  [224])aVar3 & (undefined1  [224])0x1) != (undefined1  [224])0x0) {
      lVar12 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        + 8);
      uVar4 = (uint)lVar12 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + lVar12 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [224])aVar3 & (undefined1  [224])0x2) != (undefined1  [224])0x0) {
      sVar9 = MessageOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar4 = (uint)sVar9 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar9 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [224])aVar3 & (undefined1  [224])0x4) != (undefined1  [224])0x0) {
      uVar10 = (long)(this->field_0)._impl_.visibility_ | 1;
      lVar12 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar12 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t DescriptorProto::ByteSizeLong() const {
  const DescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FieldDescriptorProto field = 2;
    {
      total_size += 1UL * this_._internal_field_size();
      for (const auto& msg : this_._internal_field()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto nested_type = 3;
    {
      total_size += 1UL * this_._internal_nested_type_size();
      for (const auto& msg : this_._internal_nested_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
    {
      total_size += 1UL * this_._internal_enum_type_size();
      for (const auto& msg : this_._internal_enum_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
    {
      total_size += 1UL * this_._internal_extension_range_size();
      for (const auto& msg : this_._internal_extension_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FieldDescriptorProto extension = 6;
    {
      total_size += 1UL * this_._internal_extension_size();
      for (const auto& msg : this_._internal_extension()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
    {
      total_size += 1UL * this_._internal_oneof_decl_size();
      for (const auto& msg : this_._internal_oneof_decl()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
    {
      total_size += 1UL * this_._internal_reserved_range_size();
      for (const auto& msg : this_._internal_reserved_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string reserved_name = 10;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_reserved_name().size());
      for (int i = 0, n = this_._internal_reserved_name().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_reserved_name().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.MessageOptions options = 7;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SymbolVisibility visibility = 11;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}